

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

void decrease_ref_count(RefCntBuffer *buf,BufferPool *pool)

{
  if (((buf != (RefCntBuffer *)0x0) && (buf->ref_count = buf->ref_count + -1, buf->ref_count == 0))
     && ((buf->raw_frame_buffer).data != (uint8_t *)0x0)) {
    (*pool->release_fb_cb)(pool->cb_priv,&buf->raw_frame_buffer);
    (buf->raw_frame_buffer).data = (uint8_t *)0x0;
    (buf->raw_frame_buffer).size = 0;
    (buf->raw_frame_buffer).priv = (void *)0x0;
  }
  return;
}

Assistant:

static inline void decrease_ref_count(RefCntBuffer *const buf,
                                      BufferPool *const pool) {
  if (buf != NULL) {
    --buf->ref_count;
    // Reference counts should never become negative. If this assertion fails,
    // there is a bug in our reference count management.
    assert(buf->ref_count >= 0);
    // A worker may only get a free framebuffer index when calling get_free_fb.
    // But the raw frame buffer is not set up until we finish decoding header.
    // So if any error happens during decoding header, frame_bufs[idx] will not
    // have a valid raw frame buffer.
    if (buf->ref_count == 0 && buf->raw_frame_buffer.data) {
      pool->release_fb_cb(pool->cb_priv, &buf->raw_frame_buffer);
      buf->raw_frame_buffer.data = NULL;
      buf->raw_frame_buffer.size = 0;
      buf->raw_frame_buffer.priv = NULL;
    }
  }
}